

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.cc
# Opt level: O0

void ** __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::InternalExtend
          (RepeatedPtrFieldBase *this,int extend_amount)

{
  int iVar1;
  Arena *this_00;
  int *piVar2;
  ulong uVar3;
  unsigned_long uVar4;
  Rep *pRVar5;
  LogMessage *pLVar6;
  size_t old_size;
  int old_total_size;
  size_t bytes;
  byte local_139;
  LogMessage local_138;
  int local_fc;
  Arena *local_f8;
  Arena *arena;
  Rep *old_rep;
  int new_size;
  int extend_amount_local;
  RepeatedPtrFieldBase *this_local;
  LogFinisher local_cd [20];
  byte local_b9;
  LogMessage local_b8;
  ulong local_80;
  Arena *local_78;
  Rep *local_70;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  ulong local_18;
  Arena *local_10;
  
  old_rep._0_4_ = this->current_size_ + extend_amount;
  if (this->total_size_ < (int)old_rep) {
    arena = (Arena *)this->rep_;
    old_rep._4_4_ = extend_amount;
    _new_size = this;
    local_f8 = GetArenaNoVirtual(this);
    local_fc = this->total_size_ << 1;
    piVar2 = std::max<int>(&local_fc,(int *)&old_rep);
    piVar2 = std::max<int>(&kMinRepeatedFieldAllocationSize,piVar2);
    old_rep._0_4_ = *piVar2;
    uVar3 = (ulong)(int)old_rep;
    uVar4 = std::numeric_limits<unsigned_long>::max();
    local_139 = 0;
    if (uVar4 - 8 >> 3 < uVar3) {
      LogMessage::LogMessage
                (&local_138,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.cc"
                 ,0x3b);
      local_139 = 1;
      pLVar6 = LogMessage::operator<<
                         (&local_138,
                          "CHECK failed: (new_size) <= ((std::numeric_limits<size_t>::max() - kRepHeaderSize) / sizeof(old_rep->elements[0])): "
                         );
      pLVar6 = LogMessage::operator<<(pLVar6,"Requested size is too large to fit into size_t.");
      LogFinisher::operator=((LogFinisher *)((long)&bytes + 3),pLVar6);
    }
    if ((local_139 & 1) != 0) {
      LogMessage::~LogMessage(&local_138);
    }
    uVar3 = (long)(int)old_rep * 8 + 8;
    if (local_f8 == (Arena *)0x0) {
      pRVar5 = (Rep *)operator_new(uVar3);
      this->rep_ = pRVar5;
    }
    else {
      local_78 = local_f8;
      local_80 = uVar3;
      uVar4 = std::numeric_limits<unsigned_long>::max();
      local_b9 = 0;
      if (uVar4 < uVar3) {
        LogMessage::LogMessage
                  (&local_b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/arena.h"
                   ,0x1c6);
        local_b9 = 1;
        pLVar6 = LogMessage::operator<<
                           (&local_b8,
                            "CHECK failed: (num_elements) <= (std::numeric_limits<size_t>::max() / sizeof(T)): "
                           );
        pLVar6 = LogMessage::operator<<(pLVar6,"Requested size is too large to fit into size_t.");
        LogFinisher::operator=(local_cd,pLVar6);
      }
      if ((local_b9 & 1) != 0) {
        LogMessage::~LogMessage(&local_b8);
      }
      this_00 = local_78;
      uVar3 = local_80;
      if (local_78 == (Arena *)0x0) {
        local_70 = (Rep *)operator_new__(local_80);
      }
      else {
        local_10 = local_78;
        local_18 = local_80;
        uVar4 = std::numeric_limits<unsigned_long>::max();
        local_51 = 0;
        if (uVar4 < uVar3) {
          LogMessage::LogMessage
                    (&local_50,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/arena.h"
                     ,0x28e);
          local_51 = 1;
          pLVar6 = LogMessage::operator<<
                             (&local_50,
                              "CHECK failed: (num_elements) <= (std::numeric_limits<size_t>::max() / sizeof(T)): "
                             );
          pLVar6 = LogMessage::operator<<(pLVar6,"Requested size is too large to fit into size_t.");
          LogFinisher::operator=(local_65,pLVar6);
        }
        if ((local_51 & 1) != 0) {
          LogMessage::~LogMessage(&local_50);
        }
        local_70 = (Rep *)Arena::AllocateAligned(this_00,(type_info *)&char::typeinfo,local_18);
      }
      this->rep_ = local_70;
    }
    iVar1 = this->total_size_;
    this->total_size_ = (int)old_rep;
    if ((arena == (Arena *)0x0) || (*(int *)arena < 1)) {
      this->rep_->allocated_size = 0;
    }
    else {
      memcpy(this->rep_->elements,arena + 8,(long)*(int *)arena << 3);
      this->rep_->allocated_size = *(int *)arena;
    }
    if (local_f8 == (Arena *)0x0) {
      operator_delete(arena,(long)iVar1 * 8 + 8);
    }
    this_local = (RepeatedPtrFieldBase *)(this->rep_->elements + this->current_size_);
  }
  else {
    this_local = (RepeatedPtrFieldBase *)(this->rep_->elements + this->current_size_);
  }
  return &this_local->arena_;
}

Assistant:

void** RepeatedPtrFieldBase::InternalExtend(int extend_amount) {
  int new_size = current_size_ + extend_amount;
  if (total_size_ >= new_size) {
    // N.B.: rep_ is non-NULL because extend_amount is always > 0, hence
    // total_size must be non-zero since it is lower-bounded by new_size.
    return &rep_->elements[current_size_];
  }
  Rep* old_rep = rep_;
  Arena* arena = GetArenaNoVirtual();
  new_size = std::max(kMinRepeatedFieldAllocationSize,
                      std::max(total_size_ * 2, new_size));
  GOOGLE_CHECK_LE(new_size,
           (std::numeric_limits<size_t>::max() - kRepHeaderSize) /
           sizeof(old_rep->elements[0]))
      << "Requested size is too large to fit into size_t.";
  size_t bytes = kRepHeaderSize + sizeof(old_rep->elements[0]) * new_size;
  if (arena == NULL) {
    rep_ = reinterpret_cast<Rep*>(::operator new(bytes));
  } else {
    rep_ = reinterpret_cast<Rep*>(
        ::google::protobuf::Arena::CreateArray<char>(arena, bytes));
  }
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
  const int old_total_size = total_size_;
#endif
  total_size_ = new_size;
  if (old_rep && old_rep->allocated_size > 0) {
    memcpy(rep_->elements, old_rep->elements,
           old_rep->allocated_size * sizeof(rep_->elements[0]));
    rep_->allocated_size = old_rep->allocated_size;
  } else {
    rep_->allocated_size = 0;
  }
  if (arena == NULL) {
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
    const size_t old_size =
        old_total_size * sizeof(rep_->elements[0]) + kRepHeaderSize;
    ::operator delete(static_cast<void*>(old_rep), old_size);
#else
    ::operator delete(static_cast<void*>(old_rep));
#endif
  }
  return &rep_->elements[current_size_];
}